

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::checkNextPragmaToken(Preprocessor *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Preprocessor *in_RDI;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar3;
  Token expected;
  SourceLocation loc;
  TokenKind in_stack_00000246;
  BumpAllocator *in_stack_00000248;
  SourceLocation in_stack_00000250;
  undefined7 in_stack_ffffffffffffff80;
  bool in_stack_ffffffffffffff87;
  SourceLocation in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  DiagCode in_stack_ffffffffffffff94;
  SimplePragmaExpressionSyntax *local_68;
  SourceLocation local_60;
  Token local_58;
  SourceLocation local_48;
  undefined4 local_3c;
  string_view local_38;
  SourceLocation local_28;
  SourceLocation local_20;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> local_10;
  
  bVar1 = peekSameLine(in_RDI);
  if (bVar1) {
    std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::pair<std::nullptr_t,_bool,_true>
              (&local_10,(void **)&stack0xffffffffffffff88,(bool *)&stack0xffffffffffffff87);
    uVar2 = extraout_RDX_00;
  }
  else {
    local_28 = Token::location(&in_RDI->lastConsumed);
    local_38 = Token::rawText((Token *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                             );
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_38);
    local_48 = SourceLocation::operator+<unsigned_long>
                         ((SourceLocation *)in_stack_ffffffffffffff88,
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    local_3c = 0x80004;
    local_20 = local_48;
    addDiag((Preprocessor *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
            in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    local_60 = local_20;
    local_58 = Token::createMissing(in_stack_00000248,in_stack_00000246,in_stack_00000250);
    local_68 = BumpAllocator::
               emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                         ((BumpAllocator *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (Token *)in_stack_ffffffffffffff88);
    std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
    pair<slang::syntax::SimplePragmaExpressionSyntax_*,_bool,_true>
              (&local_10,&local_68,(bool *)&stack0xffffffffffffff97);
    uVar2 = extraout_RDX;
  }
  pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  pVar3.second = local_10.second;
  pVar3.first = local_10.first;
  return pVar3;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::checkNextPragmaToken() {
    if (!peekSameLine()) {
        auto loc = lastConsumed.location() + lastConsumed.rawText().length();
        addDiag(diag::ExpectedPragmaExpression, loc);

        auto expected = Token::createMissing(alloc, TokenKind::Identifier, loc);
        return {alloc.emplace<SimplePragmaExpressionSyntax>(expected), false};
    }
    return {nullptr, true};
}